

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCoordsys.cpp
# Opt level: O1

Coordsys * chrono::Force2Dcsys(Coordsys *cs)

{
  Coordsys *res;
  Coordsys *in_RDI;
  
  (in_RDI->pos).m_data[2] = 0.0;
  (in_RDI->pos).m_data[0] = 0.0;
  (in_RDI->pos).m_data[1] = 0.0;
  (in_RDI->rot).m_data[0] = 1.0;
  (in_RDI->rot).m_data[1] = 0.0;
  (in_RDI->rot).m_data[2] = 0.0;
  (in_RDI->rot).m_data[3] = 0.0;
  if (cs != in_RDI) {
    (in_RDI->pos).m_data[0] = (cs->pos).m_data[0];
    (in_RDI->pos).m_data[1] = (cs->pos).m_data[1];
    (in_RDI->pos).m_data[2] = (cs->pos).m_data[2];
    (in_RDI->rot).m_data[0] = (cs->rot).m_data[0];
    (in_RDI->rot).m_data[1] = (cs->rot).m_data[1];
    (in_RDI->rot).m_data[2] = (cs->rot).m_data[2];
    (in_RDI->rot).m_data[3] = (cs->rot).m_data[3];
  }
  (in_RDI->pos).m_data[2] = 0.0;
  (in_RDI->rot).m_data[1] = 0.0;
  (in_RDI->rot).m_data[2] = 0.0;
  return in_RDI;
}

Assistant:

Coordsys Force2Dcsys(const Coordsys& cs) {
    Coordsys res;
    res = cs;
    res.pos.z() = 0;
    res.rot.e1() = 0;
    res.rot.e2() = 0;
    return (res);
}